

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O0

string * __thiscall
elf_parser::Elf_parser::get_symbol_index_abi_cxx11_
          (string *__return_storage_ptr__,Elf_parser *this,uint16_t *sym_idx)

{
  uint16_t uVar1;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  uint16_t *local_20;
  uint16_t *sym_idx_local;
  Elf_parser *this_local;
  
  uVar1 = *sym_idx;
  local_20 = sym_idx;
  sym_idx_local = (uint16_t *)this;
  this_local = (Elf_parser *)__return_storage_ptr__;
  if (uVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"UND",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
  }
  else if (uVar1 == 0xfff1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"ABS",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else if (uVar1 == 0xfff2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"COM",local_35);
    std::allocator<char>::~allocator((allocator<char> *)local_35);
  }
  else if (uVar1 == 0xffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"COM",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
  }
  else {
    std::__cxx11::to_string(__return_storage_ptr__,(uint)*sym_idx);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Elf_parser::get_symbol_index(uint16_t &sym_idx) {
    switch(sym_idx) {
        case SHN_ABS: return "ABS";
        case SHN_COMMON: return "COM";
        case SHN_UNDEF: return "UND";
        case SHN_XINDEX: return "COM";
        default: return std::to_string(sym_idx);
    }
}